

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_resampler.cc
# Opt level: O3

int __thiscall
webrtc::PushResampler<short>::Resample
          (PushResampler<short> *this,short *src,size_t src_length,short *dst,size_t dst_capacity)

{
  short *psVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  short *psVar8;
  size_t sVar9;
  ulong source_length;
  _Head_base<0UL,_short_*,_false> local_38;
  short *psStack_30;
  
  sVar3 = this->num_channels_;
  iVar4 = -1;
  if (((sVar3 * (long)this->src_sample_rate_hz_) / 100 == src_length) &&
     ((sVar3 * (long)this->dst_sample_rate_hz_) / 100 <= dst_capacity)) {
    if (this->src_sample_rate_hz_ == this->dst_sample_rate_hz_) {
      memcpy(dst,src,src_length * 2);
      iVar4 = (int)src_length;
    }
    else if (sVar3 == 2) {
      source_length = src_length >> 1;
      local_38._M_head_impl =
           (this->src_left_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
           super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
           super__Head_base<0UL,_short_*,_false>._M_head_impl;
      psStack_30 = (this->src_right_)._M_t.
                   super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
                   super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                   super__Head_base<0UL,_short_*,_false>._M_head_impl;
      lVar5 = 0;
      do {
        if (1 < src_length) {
          psVar1 = (&local_38)[lVar5]._M_head_impl;
          uVar7 = 0;
          do {
            psVar1[uVar7] = src[uVar7 * 2];
            uVar7 = uVar7 + 1;
          } while (source_length != uVar7);
        }
        lVar5 = lVar5 + 1;
        src = src + 1;
      } while (lVar5 != 2);
      sVar2 = PushSincResampler::Resample
                        ((this->sinc_resampler_)._M_t.
                         super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
                         .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl,
                         local_38._M_head_impl,source_length,
                         (this->dst_left_)._M_t.
                         super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
                         super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                         super__Head_base<0UL,_short_*,_false>._M_head_impl,dst_capacity >> 1);
      PushSincResampler::Resample
                ((this->sinc_resampler_right_)._M_t.
                 super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
                 .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl,
                 (this->src_right_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>
                 ._M_t.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                 super__Head_base<0UL,_short_*,_false>._M_head_impl,source_length,
                 (this->dst_right_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>
                 ._M_t.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                 super__Head_base<0UL,_short_*,_false>._M_head_impl,dst_capacity >> 1);
      local_38._M_head_impl =
           (this->dst_left_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
           super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
           super__Head_base<0UL,_short_*,_false>._M_head_impl;
      psStack_30 = (this->dst_right_)._M_t.
                   super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
                   super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                   super__Head_base<0UL,_short_*,_false>._M_head_impl;
      sVar3 = this->num_channels_;
      if (sVar3 != 0) {
        sVar6 = 0;
        do {
          if (sVar2 != 0) {
            psVar1 = (&local_38)[sVar6]._M_head_impl;
            sVar9 = 0;
            psVar8 = dst;
            do {
              *psVar8 = psVar1[sVar9];
              sVar9 = sVar9 + 1;
              psVar8 = psVar8 + sVar3;
            } while (sVar2 != sVar9);
          }
          sVar6 = sVar6 + 1;
          dst = dst + 1;
        } while (sVar6 != sVar3);
      }
      iVar4 = (int)sVar3 * (int)sVar2;
    }
    else {
      sVar3 = PushSincResampler::Resample
                        ((this->sinc_resampler_)._M_t.
                         super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
                         .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl,src
                         ,src_length,dst,dst_capacity);
      iVar4 = (int)sVar3;
    }
  }
  return iVar4;
}

Assistant:

int PushResampler<T>::Resample(const T* src, size_t src_length, T* dst,
                               size_t dst_capacity) {
  const size_t src_size_10ms = src_sample_rate_hz_ * num_channels_ / 100;
  const size_t dst_size_10ms = dst_sample_rate_hz_ * num_channels_ / 100;
  if (src_length != src_size_10ms || dst_capacity < dst_size_10ms)
    return -1;

  if (src_sample_rate_hz_ == dst_sample_rate_hz_) {
    // The old resampler provides this memcpy facility in the case of matching
    // sample rates, so reproduce it here for the sinc resampler.
    memcpy(dst, src, src_length * sizeof(T));
    return static_cast<int>(src_length);
  }
  if (num_channels_ == 2) {
    const size_t src_length_mono = src_length / num_channels_;
    const size_t dst_capacity_mono = dst_capacity / num_channels_;
    T* deinterleaved[] = {src_left_.get(), src_right_.get()};
    Deinterleave(src, src_length_mono, num_channels_, deinterleaved);

    size_t dst_length_mono =
        sinc_resampler_->Resample(src_left_.get(), src_length_mono,
                                  dst_left_.get(), dst_capacity_mono);
    sinc_resampler_right_->Resample(src_right_.get(), src_length_mono,
                                    dst_right_.get(), dst_capacity_mono);

    deinterleaved[0] = dst_left_.get();
    deinterleaved[1] = dst_right_.get();
    Interleave(deinterleaved, dst_length_mono, num_channels_, dst);
    return static_cast<int>(dst_length_mono * num_channels_);
  } else {
    return static_cast<int>(
        sinc_resampler_->Resample(src, src_length, dst, dst_capacity));
  }
}